

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall doctest::Context::setOption(Context *this,char *option,int value)

{
  int in_EDX;
  char *in_stack_00000068;
  Context *in_stack_00000070;
  String *in_stack_ffffffffffffff98;
  String *this_00;
  String local_30;
  
  this_00 = &local_30;
  doctest::toString(in_EDX);
  String::c_str(in_stack_ffffffffffffff98);
  setOption(in_stack_00000070,in_stack_00000068,(char *)this);
  String::~String(this_00);
  return;
}

Assistant:

void Context::setOption(const char* option, int value) {
    setOption(option, toString(value).c_str());
    // NOLINTNEXTLINE(clang-analyzer-cplusplus.NewDeleteLeaks)
}